

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::ReadLinearOffset
          (BamStandardIndex *this,uint64_t *linearOffset)

{
  IBamIODevice *pIVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  BamException *this_00;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,linearOffset,8);
  if (this->m_isBigEndian == true) {
    uVar2 = *linearOffset;
    *linearOffset =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  }
  if (CONCAT44(extraout_var,iVar3) == 8) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamStandardIndex::ReadLinearOffset",&local_59);
  std::__cxx11::string::string((string *)&local_58,"could not read BAI linear offset",&local_5a);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadLinearOffset(uint64_t& linearOffset)
{
    const int64_t numBytesRead =
        m_resources.Device->Read((char*)&linearOffset, sizeof(linearOffset));
    if (m_isBigEndian) SwapEndian_64(linearOffset);
    if (numBytesRead != sizeof(linearOffset))
        throw BamException("BamStandardIndex::ReadLinearOffset",
                           "could not read BAI linear offset");
}